

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrtran.c
# Opt level: O0

void png_init_palette_transformations(png_structrp png_ptr)

{
  ushort uVar1;
  bool bVar2;
  bool bVar3;
  int local_20;
  int istop;
  int i_1;
  int i;
  int input_has_transparency;
  int input_has_alpha;
  png_structrp png_ptr_local;
  
  bVar2 = false;
  bVar3 = false;
  if (png_ptr->num_trans != 0) {
    for (istop = 0; istop < (int)(uint)png_ptr->num_trans; istop = istop + 1) {
      if (png_ptr->trans_alpha[istop] != 0xff) {
        if (png_ptr->trans_alpha[istop] != '\0') {
          bVar3 = true;
          bVar2 = true;
          break;
        }
        bVar3 = true;
      }
    }
  }
  if (!bVar2) {
    png_ptr->transformations = png_ptr->transformations & 0xff7fffff;
    png_ptr->flags = png_ptr->flags & 0xffffdfff;
    if (!bVar3) {
      png_ptr->transformations = png_ptr->transformations & 0xfffffe7f;
    }
  }
  if (((png_ptr->transformations & 0x100) != 0) && ((png_ptr->transformations & 0x1000) != 0)) {
    (png_ptr->background).red = (ushort)png_ptr->palette[(png_ptr->background).index].red;
    (png_ptr->background).green = (ushort)png_ptr->palette[(png_ptr->background).index].green;
    (png_ptr->background).blue = (ushort)png_ptr->palette[(png_ptr->background).index].blue;
    if (((png_ptr->transformations & 0x80000) != 0) && ((png_ptr->transformations & 0x2000000) == 0)
       ) {
      uVar1 = png_ptr->num_trans;
      for (local_20 = 0; local_20 < (int)(uint)uVar1; local_20 = local_20 + 1) {
        png_ptr->trans_alpha[local_20] = 0xff - png_ptr->trans_alpha[local_20];
      }
    }
  }
  return;
}

Assistant:

static void /* PRIVATE */
png_init_palette_transformations(png_structrp png_ptr)
{
   /* Called to handle the (input) palette case.  In png_do_read_transformations
    * the first step is to expand the palette if requested, so this code must
    * take care to only make changes that are invariant with respect to the
    * palette expansion, or only do them if there is no expansion.
    *
    * STRIP_ALPHA has already been handled in the caller (by setting num_trans
    * to 0.)
    */
   int input_has_alpha = 0;
   int input_has_transparency = 0;

   if (png_ptr->num_trans > 0)
   {
      int i;

      /* Ignore if all the entries are opaque (unlikely!) */
      for (i=0; i<png_ptr->num_trans; ++i)
      {
         if (png_ptr->trans_alpha[i] == 255)
            continue;
         else if (png_ptr->trans_alpha[i] == 0)
            input_has_transparency = 1;
         else
         {
            input_has_transparency = 1;
            input_has_alpha = 1;
            break;
         }
      }
   }

   /* If no alpha we can optimize. */
   if (input_has_alpha == 0)
   {
      /* Any alpha means background and associative alpha processing is
       * required, however if the alpha is 0 or 1 throughout OPTIMIZE_ALPHA
       * and ENCODE_ALPHA are irrelevant.
       */
      png_ptr->transformations &= ~PNG_ENCODE_ALPHA;
      png_ptr->flags &= ~PNG_FLAG_OPTIMIZE_ALPHA;

      if (input_has_transparency == 0)
         png_ptr->transformations &= ~(PNG_COMPOSE | PNG_BACKGROUND_EXPAND);
   }

#if defined(PNG_READ_EXPAND_SUPPORTED) && defined(PNG_READ_BACKGROUND_SUPPORTED)
   /* png_set_background handling - deals with the complexity of whether the
    * background color is in the file format or the screen format in the case
    * where an 'expand' will happen.
    */

   /* The following code cannot be entered in the alpha pre-multiplication case
    * because PNG_BACKGROUND_EXPAND is cancelled below.
    */
   if ((png_ptr->transformations & PNG_BACKGROUND_EXPAND) != 0 &&
       (png_ptr->transformations & PNG_EXPAND) != 0)
   {
      {
         png_ptr->background.red   =
             png_ptr->palette[png_ptr->background.index].red;
         png_ptr->background.green =
             png_ptr->palette[png_ptr->background.index].green;
         png_ptr->background.blue  =
             png_ptr->palette[png_ptr->background.index].blue;

#ifdef PNG_READ_INVERT_ALPHA_SUPPORTED
        if ((png_ptr->transformations & PNG_INVERT_ALPHA) != 0)
        {
           if ((png_ptr->transformations & PNG_EXPAND_tRNS) == 0)
           {
              /* Invert the alpha channel (in tRNS) unless the pixels are
               * going to be expanded, in which case leave it for later
               */
              int i, istop = png_ptr->num_trans;

              for (i=0; i<istop; i++)
                 png_ptr->trans_alpha[i] = (png_byte)(255 -
                    png_ptr->trans_alpha[i]);
           }
        }
#endif /* READ_INVERT_ALPHA */
      }
   } /* background expand and (therefore) no alpha association. */
#endif /* READ_EXPAND && READ_BACKGROUND */
}